

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d60_q0_zipcode.cpp
# Opt level: O1

int main(void)

{
  pointer pLVar1;
  istream *piVar2;
  ostream *poVar3;
  long *plVar4;
  Letter *l_1;
  pointer pLVar5;
  int iVar6;
  int n;
  int nzip;
  ZipInfo z;
  vector<Letter,_std::allocator<Letter>_> letters;
  vector<ZipInfo,_std::allocator<ZipInfo>_> zipinfo;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  undefined1 local_e0 [16];
  string local_d0 [8];
  _Alloc_hider local_c8;
  undefined1 local_c0 [16];
  string local_b0 [8];
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  int local_70 [2];
  vector<Letter,_std::allocator<Letter>_> local_68;
  vector<ZipInfo,_std::allocator<ZipInfo>_> local_48;
  
  std::istream::operator>>((istream *)&std::cin,&local_f4);
  local_48.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<ZipInfo,_std::allocator<ZipInfo>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < local_f4) {
    iVar6 = 0;
    do {
      local_e0._0_8_ = 0;
      local_e0[8] = '\0';
      local_c0._0_8_ = 0;
      local_c0[8] = '\0';
      local_e8._M_p = local_e0 + 8;
      local_c8._M_p = local_c0 + 8;
      piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)local_f0);
      piVar2 = std::operator>>(piVar2,(string *)&local_c8);
      std::operator>>(piVar2,(string *)&local_e8);
      std::vector<ZipInfo,_std::allocator<ZipInfo>_>::push_back(&local_48,(value_type *)local_f0);
      if (local_c8._M_p != local_c0 + 8) {
        operator_delete(local_c8._M_p,CONCAT71(local_c0._9_7_,local_c0[8]) + 1);
      }
      if (local_e8._M_p != local_e0 + 8) {
        operator_delete(local_e8._M_p,CONCAT71(local_e0._9_7_,local_e0[8]) + 1);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_f4);
  }
  std::istream::operator>>((istream *)&std::cin,&local_f8);
  local_68.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < local_f8) {
    iVar6 = 0;
    do {
      local_f0 = (undefined1  [8])local_e0;
      local_e8._M_p = (pointer)0x0;
      local_e0._0_8_ = local_e0._0_8_ & 0xffffffffffffff00;
      local_c8._M_p = (pointer)0x0;
      local_c0._0_8_ = local_c0._0_8_ & 0xffffffffffffff00;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_88 = 0;
      local_80._M_local_buf[0] = '\0';
      local_d0 = (string  [8])local_c0;
      local_b0 = (string  [8])&local_a0;
      local_90._M_p = (pointer)&local_80;
      piVar2 = std::operator>>((istream *)&std::cin,(string *)local_f0);
      piVar2 = std::operator>>(piVar2,local_d0);
      piVar2 = std::operator>>(piVar2,(string *)&local_90);
      piVar2 = std::operator>>(piVar2,local_b0);
      std::istream::operator>>(piVar2,local_70);
      std::vector<Letter,_std::allocator<Letter>_>::push_back(&local_68,(value_type *)local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,
                        CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1)
        ;
      }
      if (local_b0 != (string  [8])&local_a0) {
        operator_delete((void *)local_b0,
                        CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1)
        ;
      }
      if (local_d0 != (string  [8])local_c0) {
        operator_delete((void *)local_d0,local_c0._0_8_ + 1);
      }
      if (local_f0 != (undefined1  [8])local_e0) {
        operator_delete((void *)local_f0,local_e0._0_8_ + 1);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_f8);
  }
  correctZipAndSortLetters(&local_48,&local_68);
  pLVar1 = local_68.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pLVar5 = local_68.super__Vector_base<Letter,_std::allocator<Letter>_>._M_impl.
                super__Vector_impl_data._M_start; pLVar5 != pLVar1; pLVar5 = pLVar5 + 1) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(pLVar5->name)._M_dataplus._M_p,
                        (pLVar5->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pLVar5->address)._M_dataplus._M_p,(pLVar5->address)._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pLVar5->district)._M_dataplus._M_p,
                        (pLVar5->district)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(pLVar5->province)._M_dataplus._M_p,
                        (pLVar5->province)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    plVar4 = (long *)std::ostream::operator<<(poVar3,pLVar5->zip);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
  }
  std::vector<Letter,_std::allocator<Letter>_>::~vector(&local_68);
  std::vector<ZipInfo,_std::allocator<ZipInfo>_>::~vector(&local_48);
  return 0;
}

Assistant:

int main() {
    int nzip;
    cin >> nzip;
    vector<ZipInfo> zipinfo;
    for (int i = 0; i < nzip; i++) {
        ZipInfo z;
        cin >> z.zip >> z.district >> z.province;
        zipinfo.push_back(z);
    }
    int n;
    cin >> n;
    vector<Letter> letters;
    for (int i = 0; i < n; i++) {
        Letter l;
        cin >> l.name >> l.address >> l.district >> l.province >> l.zip;
        letters.push_back(l);
    }
    correctZipAndSortLetters(zipinfo, letters);
    for (auto &l : letters) {
        cout << l.name << " " << l.address << " " << l.district << " "
             << l.province << " " << l.zip << endl;
    }
}